

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profile.cpp
# Opt level: O0

void __thiscall Profile::__displayBacktraceStaticMap(Profile *this)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  pointer ppVar3;
  shared_ptr<DynFuncCall> value;
  string key;
  iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
  *in_stack_ffffffffffffff68;
  ostream *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  char *in_stack_ffffffffffffff88;
  DynFuncCall *dfc;
  ostream *in_stack_ffffffffffffff90;
  undefined1 local_48 [48];
  _Self local_18;
  _Self local_10 [2];
  
  if ((DebugFlag) && (bVar1 = isCurrentDebugType(in_stack_ffffffffffffff88), bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"__displayBacktraceStaticMap");
    poVar2 = std::operator<<(poVar2,":");
    this_00 = (void *)std::ostream::operator<<(poVar2,0x10c);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
       ::begin(in_stack_ffffffffffffff68);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>
                           *)0x1dc1b6);
    std::__cxx11::string::string((string *)(local_48 + 0x10),(string *)ppVar3);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>
                  *)0x1dc1cd);
    dfc = (DynFuncCall *)local_48;
    std::shared_ptr<DynFuncCall>::shared_ptr
              ((shared_ptr<DynFuncCall> *)in_stack_ffffffffffffff70,
               (shared_ptr<DynFuncCall> *)in_stack_ffffffffffffff68);
    std::__shared_ptr_access<DynFuncCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<DynFuncCall,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff90 = ::operator<<(in_stack_ffffffffffffff90,dfc);
    std::ostream::operator<<(in_stack_ffffffffffffff90,std::endl<char,std::char_traits<char>>);
    if (((DebugFlag & 1U) != 0) &&
       (in_stack_ffffffffffffff7f = isCurrentDebugType((char *)dfc), (bool)in_stack_ffffffffffffff7f
       )) {
      std::__shared_ptr_access<DynFuncCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<DynFuncCall,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff70 = ::operator<<(in_stack_ffffffffffffff90,dfc);
      std::ostream::operator<<(in_stack_ffffffffffffff70,std::endl<char,std::char_traits<char>>);
    }
    std::shared_ptr<DynFuncCall>::~shared_ptr((shared_ptr<DynFuncCall> *)0x1dc2a7);
    std::__cxx11::string::~string((string *)(local_48 + 0x10));
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  }
  return;
}

Assistant:

void Profile::__displayBacktraceStaticMap(){
    DEBUG("info",cerr << __FUNCTION__ << ":" << __LINE__<< endl;);
    for (auto it = __backtraceStaticMap.begin(); it != __backtraceStaticMap.end(); it++){
        string key = it->first;
        shared_ptr<DynFuncCall>value = it->second;
        cerr << *value << endl;
        DEBUG("info",cerr << *value << endl;);
    }
}